

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgp__attach_shader(GLuint program,GLenum shader_t,GLsizei count,GLchar **source)

{
  GLchar *__ptr;
  GLchar *logv;
  GLuint local_28;
  GLint logc;
  GLuint shader;
  GLint compiled;
  GLchar **source_local;
  GLsizei count_local;
  GLenum shader_t_local;
  GLuint program_local;
  
  _shader = source;
  source_local._0_4_ = count;
  source_local._4_4_ = shader_t;
  count_local = program;
  local_28 = (*glad_glCreateShader)(shader_t);
  (*glad_glShaderSource)(local_28,(GLsizei)source_local,_shader,(GLint *)0x0);
  (*glad_glCompileShader)(local_28);
  (*glad_glGetShaderiv)(local_28,0x8b81,&logc);
  if (logc != 0) {
    (*glad_glAttachShader)(count_local,local_28);
    (*glad_glDeleteShader)(local_28);
  }
  else {
    logv._4_4_ = 0;
    (*glad_glGetShaderiv)(local_28,0x8b84,(GLint *)((long)&logv + 4));
    __ptr = (GLchar *)malloc((long)logv._4_4_);
    (*glad_glGetShaderInfoLog)(local_28,logv._4_4_,(GLsizei *)0x0,__ptr);
    fprintf(_stdout,
            "djg_error: Shader compilation failed\n-- Begin -- GLSL Compiler Info Log\n%s\n-- End -- GLSL Compiler Info Log\n"
            ,__ptr);
    fflush(_stdout);
    free(__ptr);
    (*glad_glDeleteShader)(local_28);
  }
  return logc != 0;
}

Assistant:

static bool
djgp__attach_shader(
    GLuint program,
    GLenum shader_t,
    GLsizei count,
    const GLchar **source
) {
    GLint compiled;
    GLuint shader = glCreateShader(shader_t);

    // set source and compile
    glShaderSource(shader, count, source, NULL);
    glCompileShader(shader);

    // check compilation
    glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
    if (!compiled) {
        GLint logc = 0;
        GLchar *logv = NULL;

        // retrieve GLSL compiler information and log
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logc);
        logv = (GLchar *)DJG_MALLOC(logc);
        glGetShaderInfoLog(shader, logc, NULL, logv);
        DJG_LOG("djg_error: Shader compilation failed\n"\
                "-- Begin -- GLSL Compiler Info Log\n"          \
                "%s\n"                                          \
                "-- End -- GLSL Compiler Info Log\n", logv);
        DJG_FREE(logv);

        glDeleteShader(shader);
        return false;
    }

    // attach shader and flag for deletion
    glAttachShader(program, shader);
    glDeleteShader(shader);
    return true;
}